

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O3

Vec_Bit_t * Acec_MapXorIns(Gia_Man_t *p,Vec_Int_t *vXors)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Vec_Bit_t *pVVar4;
  int *__s;
  uint uVar5;
  uint uVar6;
  size_t __size;
  int iVar7;
  
  iVar7 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  pVVar4 = (Vec_Bit_t *)malloc(0x10);
  uVar6 = iVar7 * 0x20;
  pVVar4->nCap = uVar6;
  if (iVar7 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar7 << 2;
    __s = (int *)malloc(__size);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = uVar6;
  memset(__s,0,__size);
  uVar1 = vXors->nSize;
  if (0 < (int)uVar1) {
    uVar5 = 1;
    do {
      if ((int)uVar1 <= (int)uVar5) {
LAB_0068798c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar3 = vXors->pArray;
      uVar2 = piVar3[uVar5];
      if (((int)uVar2 < 0) || ((int)uVar6 <= (int)uVar2)) {
LAB_0068796d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      __s[uVar2 >> 5] = __s[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
      if (uVar1 <= uVar5 + 1) goto LAB_0068798c;
      uVar2 = piVar3[uVar5 + 1];
      if (((int)uVar2 < 0) || (uVar6 <= uVar2)) goto LAB_0068796d;
      __s[uVar2 >> 5] = __s[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
      if (uVar1 <= uVar5 + 2) goto LAB_0068798c;
      uVar2 = piVar3[uVar5 + 2];
      if (((int)uVar2 < 0) || (uVar6 <= uVar2)) goto LAB_0068796d;
      __s[uVar2 >> 5] = __s[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
      iVar7 = uVar5 + 3;
      uVar5 = uVar5 + 4;
    } while (iVar7 < (int)uVar1);
  }
  return pVVar4;
}

Assistant:

Vec_Bit_t * Acec_MapXorIns( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Bit_t * vMap = Vec_BitStart( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
    {
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i+1), 1 );
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i+2), 1 );
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i+3), 1 );
    }
    return vMap;
}